

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Ok> *
wasm::WATParser::maybeLabelidx<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,bool inDelegate)

{
  optional<unsigned_int> oVar1;
  undefined1 local_38 [8];
  optional<wasm::Name> id;
  
  oVar1 = Lexer::takeU<unsigned_int>(&ctx->in);
  if ((((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) &&
     (Lexer::takeID((optional<wasm::Name> *)local_38,&ctx->in),
     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
     super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01')) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::LabelIdxT> maybeLabelidx(Ctx& ctx, bool inDelegate) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getLabelFromIdx(*x, inDelegate);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getLabelFromName(*id, inDelegate);
  }
  return {};
}